

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddCircleFilled(ImDrawList *this,ImVec2 *center,float radius,ImU32 col,int num_segments)

{
  int in_ECX;
  uint in_EDX;
  long in_RDI;
  float in_XMM0_Da;
  float a_max;
  int in_stack_00000028;
  int in_stack_0000002c;
  int in_stack_00000030;
  float in_stack_00000034;
  ImVec2 *in_stack_00000038;
  ImDrawList *in_stack_00000040;
  int in_stack_00000058;
  float in_stack_0000005c;
  float in_stack_00000060;
  float in_stack_00000064;
  ImVec2 *in_stack_00000068;
  ImDrawList *in_stack_00000070;
  float in_stack_ffffffffffffffe0;
  
  if (((in_EDX & 0xff000000) != 0) && (0.5 <= in_XMM0_Da)) {
    if (in_ECX < 1) {
      _PathArcToFastEx(in_stack_00000040,in_stack_00000038,in_stack_00000034,in_stack_00000030,
                       in_stack_0000002c,in_stack_00000028);
      *(int *)(in_RDI + 0x78) = *(int *)(in_RDI + 0x78) + -1;
    }
    else {
      in_ECX = ImClamp<int>(in_ECX,3,0x200);
      in_stack_ffffffffffffffe0 = (((float)in_ECX - 1.0) * 6.2831855) / (float)in_ECX;
      PathArcTo(in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000060,
                in_stack_0000005c,in_stack_00000058);
    }
    PathFillConvex((ImDrawList *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                   (ImU32)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void ImDrawList::AddCircleFilled(const ImVec2& center, float radius, ImU32 col, int num_segments)
{
    if ((col & IM_COL32_A_MASK) == 0 || radius < 0.5f)
        return;

    if (num_segments <= 0)
    {
        // Use arc with automatic segment count
        _PathArcToFastEx(center, radius, 0, IM_DRAWLIST_ARCFAST_SAMPLE_MAX, 0);
        _Path.Size--;
    }
    else
    {
        // Explicit segment count (still clamp to avoid drawing insanely tessellated shapes)
        num_segments = ImClamp(num_segments, 3, IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_MAX);

        // Because we are filling a closed shape we remove 1 from the count of segments/points
        const float a_max = (IM_PI * 2.0f) * ((float)num_segments - 1.0f) / (float)num_segments;
        PathArcTo(center, radius, 0.0f, a_max, num_segments - 1);
    }

    PathFillConvex(col);
}